

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O3

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
::vine_swap(Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
            *this,Index columnIndex1,Index columnIndex2)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  long lVar5;
  ID_index IVar6;
  Column_dimension_option CVar7;
  ID_index IVar8;
  bool bVar9;
  Index IVar10;
  long *plVar11;
  ulong uVar12;
  long *plVar13;
  uint *puVar14;
  long lVar15;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
  *pIVar16;
  ID_index pivot;
  uint uVar17;
  uint uVar18;
  long lVar19;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
  *pIVar20;
  anon_class_1_0_00000001 local_3c;
  anon_class_1_0_00000001 local_3b;
  anon_class_1_0_00000001 local_3a;
  anon_class_1_0_00000001 local_39;
  anon_class_8_1_e4bd5e45 local_38;
  
  lVar5 = *(long *)((long)&this[1].birthComp_.super__Function_base._M_functor + 8);
  lVar19 = (ulong)columnIndex1 * 0x40;
  puVar14 = (uint *)(lVar5 + lVar19 + 0x14);
  uVar12 = (ulong)*(uint *)(lVar5 + lVar19 + 0x18);
  if (uVar12 == 0xffffffff) {
    uVar12 = (ulong)*(uint *)(lVar5 + 0x18 + (ulong)columnIndex2 * 0x40);
    if (uVar12 == 0xffffffff) {
      uVar18 = *puVar14;
    }
    else {
      uVar18 = *puVar14;
      if (*(uint *)(lVar5 + 0x14 + uVar12 * 0x40) <
          *(uint *)(lVar5 + (ulong)columnIndex2 * 0x40 + 0x14)) {
LAB_001d18fb:
        lVar15 = (ulong)columnIndex2 * 0x40;
        plVar11 = (long *)(lVar5 + lVar15 + 0x30);
        plVar13 = plVar11;
        do {
          plVar13 = (long *)*plVar13;
          if (plVar13 == plVar11) {
            return columnIndex1;
          }
        } while (*(uint *)(plVar13 + 2) != uVar18);
        pIVar16 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
                   *)(lVar5 + lVar15);
        uVar18 = *(uint *)(lVar5 + 0x14 + lVar15);
        pIVar20 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
                   *)(lVar19 + lVar5);
        local_38.targetColumn = pIVar16;
        bVar9 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gud____matrix::Column_types)7,false,false,true,true,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                          (pIVar20,pIVar16,&local_39,&local_38,&local_3a,&local_3b,&local_3c);
        if (bVar9) {
          CVar7.dim_ = (pIVar16->super_Column_dimension_option).dim_;
          IVar8 = (pIVar16->super_Chain_column_option).pivot_;
          IVar6 = (pIVar20->super_Chain_column_option).pivot_;
          pIVar16->super_Column_dimension_option =
               (Column_dimension_option)(pIVar20->super_Column_dimension_option).dim_;
          (pIVar16->super_Chain_column_option).pivot_ = IVar6;
          pIVar20->super_Column_dimension_option = (Column_dimension_option)CVar7.dim_;
          (pIVar20->super_Chain_column_option).pivot_ = IVar8;
        }
        uVar1 = (pIVar16->super_Chain_column_option).pivot_;
        if (uVar18 == uVar1) {
          return columnIndex1;
        }
        lVar5 = *(long *)&this[1].deathComp_.super__Function_base._M_functor;
        uVar4 = *(undefined4 *)(lVar5 + (ulong)uVar18 * 4);
        *(undefined4 *)(lVar5 + (ulong)uVar18 * 4) = *(undefined4 *)(lVar5 + (ulong)uVar1 * 4);
        *(undefined4 *)(lVar5 + (ulong)uVar1 * 4) = uVar4;
        return columnIndex1;
      }
    }
LAB_001d1992:
    plVar11 = (long *)(lVar5 + (ulong)columnIndex2 * 0x40 + 0x30);
    plVar13 = plVar11;
    while (plVar13 = (long *)*plVar13, plVar13 != plVar11) {
      if (*(uint *)(plVar13 + 2) == uVar18) {
        IVar10 = _positive_vine_swap(this,columnIndex1,columnIndex2);
        return IVar10;
      }
    }
  }
  else {
    uVar18 = *puVar14;
    uVar1 = *(uint *)(lVar5 + 0x14 + uVar12 * 0x40);
    lVar15 = (ulong)columnIndex2 * 0x40;
    uVar12 = (ulong)*(uint *)(lVar5 + 0x18 + lVar15);
    if (uVar12 == 0xffffffff) {
      uVar17 = uVar18;
      if (uVar18 <= uVar1) goto LAB_001d1992;
    }
    else {
      uVar2 = *(uint *)(lVar5 + lVar15 + 0x14);
      uVar3 = *(uint *)(lVar5 + 0x14 + uVar12 * 0x40);
      uVar17 = *puVar14;
      if ((uVar1 < uVar18) && (uVar3 < uVar2)) {
        plVar11 = (long *)(lVar5 + lVar15 + 0x30);
        plVar13 = plVar11;
        do {
          plVar13 = (long *)*plVar13;
          if (plVar13 == plVar11) {
            return columnIndex1;
          }
        } while (*(uint *)(plVar13 + 2) != uVar17);
        IVar10 = _negative_vine_swap(this,columnIndex1,columnIndex2);
        return IVar10;
      }
      if (uVar18 <= uVar1) {
        uVar18 = uVar17;
        if (uVar3 < uVar2) goto LAB_001d18fb;
        goto LAB_001d1992;
      }
    }
    plVar11 = (long *)(lVar5 + lVar15 + 0x30);
    plVar13 = plVar11;
    do {
      plVar13 = (long *)*plVar13;
      if (plVar13 == plVar11) {
        return columnIndex1;
      }
    } while (*(uint *)(plVar13 + 2) != uVar17);
    pIVar20 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
               *)(lVar19 + lVar5);
    pIVar16 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
               *)(lVar15 + lVar5);
    local_38.targetColumn = pIVar20;
    bVar9 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gud____matrix::Column_types)7,false,false,true,true,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                      (pIVar16,pIVar20,&local_39,&local_38,&local_3a,&local_3b,&local_3c);
    if (bVar9) {
      CVar7.dim_ = (pIVar20->super_Column_dimension_option).dim_;
      IVar8 = (pIVar20->super_Chain_column_option).pivot_;
      IVar6 = (pIVar16->super_Chain_column_option).pivot_;
      pIVar20->super_Column_dimension_option =
           (Column_dimension_option)(pIVar16->super_Column_dimension_option).dim_;
      (pIVar20->super_Chain_column_option).pivot_ = IVar6;
      pIVar16->super_Column_dimension_option = (Column_dimension_option)CVar7.dim_;
      (pIVar16->super_Chain_column_option).pivot_ = IVar8;
    }
    uVar18 = (pIVar20->super_Chain_column_option).pivot_;
    columnIndex1 = columnIndex2;
    if (uVar17 != uVar18) {
      lVar5 = *(long *)&this[1].deathComp_.super__Function_base._M_functor;
      uVar4 = *(undefined4 *)(lVar5 + (ulong)uVar17 * 4);
      *(undefined4 *)(lVar5 + (ulong)uVar17 * 4) = *(undefined4 *)(lVar5 + (ulong)uVar18 * 4);
      *(undefined4 *)(lVar5 + (ulong)uVar18 * 4) = uVar4;
    }
  }
  return columnIndex1;
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::vine_swap(Index columnIndex1,
                                                                                                Index columnIndex2)
{
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    GUDHI_CHECK(CP::are_adjacent(_matrix()->get_pivot(columnIndex1), _matrix()->get_pivot(columnIndex2)),
                std::invalid_argument(
                    "Chain_vine_swap::vine_swap - Columns to be swapped need to be adjacent in the 'real' matrix."));
  }

  const bool col1IsNeg = _is_negative_in_pair(columnIndex1);
  const bool col2IsNeg = _is_negative_in_pair(columnIndex2);

  if (col1IsNeg && col2IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::negative_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _negative_vine_swap(columnIndex1, columnIndex2);
  }

  if (col1IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::negative_positive_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _negative_positive_vine_swap(columnIndex1, columnIndex2);
  }

  if (col2IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::positive_negative_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _positive_negative_vine_swap(columnIndex1, columnIndex2);
  }

  if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
      ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

      CP::positive_transpose(pivot1, pivot2);
      CP::swap_positions(pivot1, pivot2);
    }
    return columnIndex1;
  }
  return _positive_vine_swap(columnIndex1, columnIndex2);
}